

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::createLoopExit(Builder *this)

{
  _Elt_pointer pLVar1;
  Block *block;
  
  pLVar1 = (this->loops).c.
           super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pLVar1 == (this->loops).c.
                super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pLVar1 = (this->loops).c.
             super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  block = pLVar1[-1].merge;
  createBranch(this,block);
  createAndSetNoPredecessorBlock(this,(char *)block);
  return;
}

Assistant:

void Builder::createLoopExit()
{
    createBranch(&loops.top().merge);
    // Set up a block for dead code.
    createAndSetNoPredecessorBlock("post-loop-break");
}